

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::assign
          (prevector<8U,_int,_unsigned_int,_int> *this,size_type n,int *val)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  uVar2 = this->_size;
  if (uVar2 < 9) {
    uVar3 = 8;
  }
  else {
    uVar3 = (this->_union).indirect_contents.capacity;
  }
  if (uVar3 < n) {
    change_capacity(this,n);
    uVar2 = this->_size;
  }
  this->_size = uVar2 + n;
  if (8 < uVar2 + n) {
    this = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__fill_n_a<int*,long,int>(this,n,val);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void assign(size_type n, const T& val) {
        clear();
        if (capacity() < n) {
            change_capacity(n);
        }
        _size += n;
        fill(item_ptr(0), n, val);
    }